

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintThreeGeneric.cpp
# Opt level: O2

void __thiscall
chrono::ChConstraintThreeGeneric::Increment_q(ChConstraintThreeGeneric *this,double deltal)

{
  double local_60;
  MatrixBase<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>> local_58 [24];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_40;
  
  local_60 = deltal;
  if (((this->super_ChConstraintThree).variables_a)->disabled == false) {
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator*
              (&local_40,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&this->Eq_a,&local_60);
    ChVariables::Get_qb((ChVectorRef *)local_58,(this->super_ChConstraintThree).variables_a);
    Eigen::MatrixBase<Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>>::
    operator+=(local_58,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                         *)&local_40);
  }
  if (((this->super_ChConstraintThree).variables_b)->disabled == false) {
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator*
              (&local_40,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&this->Eq_b,&local_60);
    ChVariables::Get_qb((ChVectorRef *)local_58,(this->super_ChConstraintThree).variables_b);
    Eigen::MatrixBase<Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>>::
    operator+=(local_58,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                         *)&local_40);
  }
  if (((this->super_ChConstraintThree).variables_c)->disabled == false) {
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator*
              (&local_40,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&this->Eq_c,&local_60);
    ChVariables::Get_qb((ChVectorRef *)local_58,(this->super_ChConstraintThree).variables_c);
    Eigen::MatrixBase<Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>>::
    operator+=(local_58,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                         *)&local_40);
  }
  return;
}

Assistant:

void ChConstraintThreeGeneric::Increment_q(const double deltal) {
    if (variables_a->IsActive()) {
        variables_a->Get_qb() += Eq_a * deltal;
    }

    if (variables_b->IsActive()) {
        variables_b->Get_qb() += Eq_b * deltal;
    }

    if (variables_c->IsActive()) {
        variables_c->Get_qb() += Eq_c * deltal;
    }
}